

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

bool re2::RE2::Arg::parse_longlong_radix(char *str,size_t n,void *dest,int radix)

{
  char *__nptr;
  int *piVar1;
  longlong lVar2;
  char *end;
  char buf [33];
  size_t local_68;
  char *local_60;
  char local_58 [40];
  
  if (n != 0) {
    local_68 = n;
    __nptr = TerminateNumber(local_58,0x21,str,&local_68,false);
    piVar1 = __errno_location();
    *piVar1 = 0;
    lVar2 = strtoll(__nptr,&local_60,radix);
    if (local_60 != __nptr + local_68) {
      return false;
    }
    if (*piVar1 == 0) {
      if (dest == (void *)0x0) {
        return true;
      }
      *(longlong *)dest = lVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool RE2::Arg::parse_longlong_radix(const char* str,
                                    size_t n,
                                    void* dest,
                                    int radix) {
  if (n == 0) return false;
  char buf[kMaxNumberLength+1];
  str = TerminateNumber(buf, sizeof buf, str, &n, false);
  char* end;
  errno = 0;
  long long r = strtoll(str, &end, radix);
  if (end != str + n) return false;   // Leftover junk
  if (errno) return false;
  if (dest == NULL) return true;
  *(reinterpret_cast<long long*>(dest)) = r;
  return true;
}